

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void __thiscall
kratos::InsertSyncReset::inject_reset_logic
          (InsertSyncReset *this,SequentialStmtBlock *block,Port *port)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Port *port_00;
  bool bVar3;
  shared_ptr<kratos::IfStmt> sVar4;
  undefined1 local_c8 [8];
  shared_ptr<kratos::Stmt> stmt;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined1 local_98 [8];
  shared_ptr<kratos::IfStmt> if_;
  shared_ptr<kratos::ScopedStmtBlock> else_body;
  shared_ptr<kratos::ScopedStmtBlock> body_1;
  shared_ptr<kratos::IfStmt> sync_reset;
  shared_ptr<kratos::Var> target;
  shared_ptr<kratos::ScopedStmtBlock> body;
  shared_ptr<kratos::IfStmt> sync_reset_1;
  
  p_Var2 = &((block->super_StmtBlock).stmts_.
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
  if ((long)(block->super_StmtBlock).stmts_.
            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var2 != 0x10) {
    return;
  }
  std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)local_c8,p_Var2);
  if (*(StatementType *)((long)local_c8 + 0x78) != If) goto LAB_001f3390;
  Stmt::as<kratos::IfStmt>((Stmt *)local_98);
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)((long)local_98 + 0xc0));
  bVar3 = has_port_type((Var *)stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi,AsyncReset);
  if ((bVar3) &&
     (bVar3 = has_port_type((Var *)stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi,Reset), !bVar3)) {
    port_00 = *(Port **)((long)local_98 + 0xe0);
    std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
               &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_98 + 0xf0));
    if (*(long *)&if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi[0xc]._M_use_count -
        (long)if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              [0xc]._vptr__Sp_counted_base == 0x10) {
      std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                 &body_1.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                 if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi[0xc]._vptr__Sp_counted_base);
      if (body_1.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi[7]._M_use_count != 0) {
LAB_001f32e2:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sync_reset);
        goto LAB_001f32eb;
      }
      Stmt::as<kratos::IfStmt>
                ((Stmt *)&target.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 (target.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi + 0xc));
      bVar3 = has_port_type((Var *)sync_reset.
                                   super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi,ClockEnable);
      if ((bVar3) && (this->over_clk_en_ == false)) {
        p_Var2 = (__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                 target.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi[0xe]._vptr__Sp_counted_base[0x18];
        if (p_Var2 == (__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                      target.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi[0xe]._vptr__Sp_counted_base[0x19]) {
LAB_001f34cb:
          (**(code **)(*target.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi[0xe]._vptr__Sp_counted_base + 0x58))
                    (&body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          Stmt::as<kratos::ScopedStmtBlock>
                    ((Stmt *)&else_body.
                              super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sync_reset_1);
          create_if_stmt_wrapper
                    ((StmtBlock *)
                     &body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,port_00,SUB81(port,0));
          IfStmt::set_else((IfStmt *)
                           body.
                           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi,
                           (shared_ptr<kratos::ScopedStmtBlock> *)
                           &else_body.
                            super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
          (**(code **)(*target.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi[0xe]._vptr__Sp_counted_base + 0x60))();
          std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<kratos::IfStmt,void>
                    (local_a8,(__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)
                              &body.
                               super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount);
          IfStmt::add_then_stmt
                    ((IfStmt *)
                     target.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi,(shared_ptr<kratos::Stmt> *)local_a8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sync_reset_1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&body_1);
        }
        else {
          std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                     &else_body.
                      super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,p_Var2);
          iVar1 = else_body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi[7]._M_use_count;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&body_1);
          if (iVar1 != 0) goto LAB_001f34cb;
          std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                     &body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                     target.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi[0xe]._vptr__Sp_counted_base[0x18]);
          Stmt::as<kratos::IfStmt>
                    ((Stmt *)&else_body.
                              super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sync_reset_1);
          std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                     &body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                     (else_body.
                      super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 0xc));
          bVar3 = has_port_type((Var *)body.
                                       super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi,Reset);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sync_reset_1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&body_1);
          if (!bVar3) goto LAB_001f34cb;
        }
        goto LAB_001f3354;
      }
      bVar3 = has_port_type((Var *)sync_reset.
                                   super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi,Reset);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&target);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&body);
      if (!bVar3) goto LAB_001f32e2;
    }
    else {
LAB_001f32eb:
      sVar4 = create_if_stmt_wrapper
                        ((StmtBlock *)
                         &body_1.
                          super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,port_00,SUB81(port,0));
      (*(if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[0xb])
                (&sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi,sVar4.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
      Stmt::as<kratos::ScopedStmtBlock>
                ((Stmt *)&target.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&target);
      IfStmt::set_else((IfStmt *)
                       body_1.
                       super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi,
                       (shared_ptr<kratos::ScopedStmtBlock> *)
                       &target.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
      (*(if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[0xc])();
      this_00 = &sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IfStmt,void>
                ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)this_00,
                 (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)
                 &body_1.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      StmtBlock::add_stmt((StmtBlock *)
                          if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,(shared_ptr<kratos::Stmt> *)this_00);
LAB_001f3354:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&target);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&body);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sync_reset);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&else_body);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_);
LAB_001f3390:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  return;
}

Assistant:

void inject_reset_logic(SequentialStmtBlock* block, Port* port) const {
        // only inject when there is a async reset logic
        auto stmts_count = block->size();
        if (stmts_count != 1) return;
        auto stmt = block->get_stmt(0);
        if (stmt->type() != StatementType::If) return;
        auto if_ = stmt->as<IfStmt>();
        auto const& cond = if_->predicate();
        // if it doesn't have async reset logic, or it already has sync reset logic
        // quit
        if (!has_port_type(cond.get(), PortType::AsyncReset) ||
            has_port_type(cond.get(), PortType::Reset))
            return;
        auto* reset_stmt = if_->then_body().get();
        // okay we have reset now. now we need to detect if it has clock enable
        // logic or not
        // we need to detect the clock enable logic and make sure that the ordering is what
        // specified in the
        auto else_body = if_->else_body();
        // detect if clock enable have been in place
        if (else_body->size() == 1) {
            auto then_stmt = else_body->get_stmt(0);
            if (then_stmt->type() == StatementType::If) {
                auto if_then = then_stmt->as<IfStmt>();
                auto target = if_then->predicate();
                if (has_port_type(target.get(), PortType::ClockEnable) && !over_clk_en_) {
                    // could be the case that it already has a reset
                    if (!if_then->then_body()->empty() &&
                        if_then->then_body()->get_stmt(0)->type() == StatementType::If) {
                        auto if_2 = if_then->then_body()->get_stmt(0)->as<IfStmt>();
                        // user already put it there
                        if (has_port_type(if_2->predicate().get(), PortType::Reset)) return;
                    }
                    // insert inside the clock enable body
                    auto body = if_then->then_body()->clone()->as<ScopedStmtBlock>();
                    // need to duplicate the logic in reset
                    auto sync_reset = create_if_stmt_wrapper(reset_stmt, *port, true);
                    sync_reset->set_else(body);
                    if_then->then_body()->clear();
                    if_then->add_then_stmt(sync_reset);
                    return;
                } else if (has_port_type(target.get(), PortType::Reset)) {
                    // already has a sync reset
                    return;
                }
            }
        }
        auto sync_reset = create_if_stmt_wrapper(reset_stmt, *port, true);
        auto body = else_body->clone()->as<ScopedStmtBlock>();
        sync_reset->set_else(body);
        else_body->clear();
        else_body->add_stmt(sync_reset);
    }